

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O2

int arkInterpInit_Lagrange(void *arkode_mem,ARKInterp I,realtype tnew)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  ulong uVar4;
  ulong uVar5;
  uint nvec;
  long lVar6;
  long lVar7;
  uint *puVar8;
  
  if (arkode_mem == (void *)0x0) {
    return -0x15;
  }
  puVar8 = (uint *)I->content;
  if ((int)puVar8[1] < (int)*puVar8) {
    if (*(void **)(puVar8 + 4) != (void *)0x0) {
      free(*(void **)(puVar8 + 4));
      puVar8 = (uint *)I->content;
      puVar8[4] = 0;
      puVar8[5] = 0;
    }
    if (*(long *)(puVar8 + 2) != 0) {
      lVar6 = 0;
      for (lVar7 = 0; pvVar3 = *(void **)(puVar8 + 2), lVar7 < (int)*puVar8; lVar7 = lVar7 + 1) {
        if (*(long *)((long)pvVar3 + lVar6) != 0) {
          arkFreeVec((ARKodeMem)arkode_mem,(N_Vector *)((long)pvVar3 + lVar6));
          *(undefined8 *)(*(long *)((long)I->content + 8) + lVar6) = 0;
          puVar8 = (uint *)I->content;
        }
        lVar6 = lVar6 + 8;
      }
      free(pvVar3);
      puVar8 = (uint *)I->content;
      puVar8[2] = 0;
      puVar8[3] = 0;
    }
  }
  if (*(long *)(puVar8 + 4) == 0) {
    pvVar3 = malloc((long)(int)*puVar8 << 3);
    *(void **)(puVar8 + 4) = pvVar3;
    if (pvVar3 == (void *)0x0) goto LAB_003b6281;
  }
  uVar1 = *puVar8;
  if (*(long *)(puVar8 + 2) != 0) {
LAB_003b61ed:
    nvec = puVar8[1];
    if ((int)puVar8[1] < (int)uVar1) {
      puVar8[1] = uVar1;
      nvec = uVar1;
    }
    uVar4 = 0;
    uVar5 = 0;
    if (0 < (int)nvec) {
      uVar5 = (ulong)nvec;
    }
    for (; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      *(undefined8 *)(*(long *)(puVar8 + 4) + uVar4 * 8) = 0;
    }
    iVar2 = N_VConstVectorArray(nvec,0.0,*(N_Vector **)(puVar8 + 2));
    if (iVar2 != 0) {
      return -0x1c;
    }
    pvVar3 = I->content;
    **(realtype **)((long)pvVar3 + 0x10) = tnew;
    N_VScale(1.0,*(N_Vector *)((long)arkode_mem + 0x110),
             (N_Vector)**(undefined8 **)((long)pvVar3 + 8));
    *(undefined4 *)((long)I->content + 0x18) = 1;
    return 0;
  }
  pvVar3 = malloc((long)(int)uVar1 << 3);
  *(void **)(puVar8 + 2) = pvVar3;
  if (pvVar3 != (void *)0x0) {
    lVar6 = 0;
    lVar7 = 0;
    do {
      puVar8 = (uint *)I->content;
      uVar1 = *puVar8;
      if ((int)uVar1 <= lVar7) goto LAB_003b61ed;
      *(undefined8 *)(*(long *)(puVar8 + 2) + lVar6) = 0;
      iVar2 = arkAllocVec((ARKodeMem)arkode_mem,*(N_Vector *)((long)arkode_mem + 0x110),
                          (N_Vector *)(*(long *)((long)I->content + 8) + lVar6));
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 8;
    } while (iVar2 != 0);
  }
LAB_003b6281:
  (*I->ops->free)(arkode_mem,I);
  return -0x14;
}

Assistant:

int arkInterpInit_Lagrange(void* arkode_mem, ARKInterp I,
                           realtype tnew)
{
  int i;
  ARKodeMem ark_mem;

  /* access ARKodeMem structure */
  if (arkode_mem == NULL)  return(ARK_MEM_NULL);
  ark_mem = (ARKodeMem) arkode_mem;

  /* check if storage has increased since the last init */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I)) {
    if (LINT_THIST(I) != NULL) {
      free(LINT_THIST(I));
      LINT_THIST(I) = NULL;
    }
    if (LINT_YHIST(I) != NULL) {
      for (i=0; i<LINT_NMAX(I); i++) {
        if (LINT_YJ(I,i) != NULL) {
          arkFreeVec(ark_mem, &(LINT_YJ(I,i)));
          LINT_YJ(I,i) = NULL;
        }
      }
      free(LINT_YHIST(I));
      LINT_YHIST(I) = NULL;
    }
  }

  /* allocate storage for time and solution histories */
  if (LINT_THIST(I) == NULL) {
    LINT_THIST(I) = (realtype*) malloc(LINT_NMAX(I) * sizeof(realtype));
    if (LINT_THIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
  }

  /* solution history allocation */
  if (LINT_YHIST(I) == NULL) {
    LINT_YHIST(I) = (N_Vector*) malloc(LINT_NMAX(I) * sizeof(N_Vector));
    if (LINT_YHIST(I) == NULL) {
      arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
    }
    for (i=0; i<LINT_NMAX(I); i++) {
      LINT_YJ(I,i) = NULL;
      if (!arkAllocVec(ark_mem, ark_mem->yn, &(LINT_YJ(I,i)))) {
        arkInterpFree(ark_mem, I); return(ARK_MEM_FAIL);
      }
    }
  }

  /* update allocated size if necesary */
  if (LINT_NMAX(I) > LINT_NMAXALLOC(I))
    LINT_NMAXALLOC(I) = LINT_NMAX(I);

  /* zero out history (to be safe) */
  for (i=0; i<LINT_NMAXALLOC(I); i++)
    LINT_TJ(I,i) = RCONST(0.0);
  if (N_VConstVectorArray(LINT_NMAXALLOC(I), RCONST(0.0), LINT_YHIST(I)))
    return(ARK_VECTOROP_ERR);

  /* set current time and state as first entries of (t,y) history, update counter */
  LINT_TJ(I,0) = tnew;
  N_VScale(ONE, ark_mem->yn, LINT_YJ(I,0));
  LINT_NHIST(I) = 1;

  /* return with success */
  return(ARK_SUCCESS);
}